

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_12a34eb::MemPoolAccept::PolicyScriptChecks
          (MemPoolAccept *this,ATMPArgs *args,Workspace *ws)

{
  CCoinsViewCache *inputs;
  vector<COutPoint,_std::allocator<COutPoint>_> **txdata;
  long lVar1;
  CTransaction *tx;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  string local_c0;
  string local_a0;
  TxValidationState state_dummy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tx = *(CTransaction **)
        ((args[3].m_chainparams)->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems;
  inputs = &this->m_view;
  txdata = &args[4].m_coins_to_uncache;
  bVar2 = CheckInputScripts(tx,(TxValidationState *)&args[3].m_bypass_limits,inputs,0x1fffdf,true,
                            false,(PrecomputedTransactionData *)txdata,
                            &this->m_active_chainstate->m_chainman->m_validation_cache,
                            (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
  if (!bVar2) {
    state_dummy.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&state_dummy.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
    state_dummy.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
    state_dummy.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
    state_dummy.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
    state_dummy.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
         '\0';
    state_dummy.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state_dummy.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
    state_dummy.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
    state_dummy.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    if (tx->m_has_witness == false) {
      bVar3 = CheckInputScripts(tx,&state_dummy,inputs,0x1ff6df,true,false,
                                (PrecomputedTransactionData *)txdata,
                                &this->m_active_chainstate->m_chainman->m_validation_cache,
                                (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
      if (bVar3) {
        bVar3 = CheckInputScripts(tx,&state_dummy,inputs,0x1ffedf,true,false,
                                  (PrecomputedTransactionData *)txdata,
                                  &this->m_active_chainstate->m_chainman->m_validation_cache,
                                  (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
        if (!bVar3) {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,args[3].m_coins_to_uncache,
                     (long)&((args[3].m_coins_to_uncache)->
                            super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
                            super__Vector_impl_data._M_start + *(long *)&args[3].m_test_accept);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,*(long *)&args[3].m_allow_carveouts,
                     ((args[4].m_chainparams)->consensus).hashGenesisBlock.super_base_blob<256U>.
                     m_data._M_elems + *(long *)&args[3].m_allow_carveouts);
          ValidationState<TxValidationResult>::Invalid
                    ((ValidationState<TxValidationResult> *)&args[3].m_bypass_limits,
                     TX_WITNESS_STRIPPED,&local_a0,&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state_dummy.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p !=
        &state_dummy.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
      operator_delete(state_dummy.super_ValidationState<TxValidationResult>.m_debug_message.
                      _M_dataplus._M_p,
                      CONCAT71(state_dummy.super_ValidationState<TxValidationResult>.m_debug_message
                               .field_2._M_allocated_capacity._1_7_,
                               state_dummy.super_ValidationState<TxValidationResult>.m_debug_message
                               .field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state_dummy.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p !=
        &state_dummy.super_ValidationState<TxValidationResult>.m_reject_reason.field_2) {
      operator_delete(state_dummy.super_ValidationState<TxValidationResult>.m_reject_reason.
                      _M_dataplus._M_p,
                      CONCAT71(state_dummy.super_ValidationState<TxValidationResult>.m_reject_reason
                               .field_2._M_allocated_capacity._1_7_,
                               state_dummy.super_ValidationState<TxValidationResult>.m_reject_reason
                               .field_2._M_local_buf[0]) + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool MemPoolAccept::PolicyScriptChecks(const ATMPArgs& args, Workspace& ws)
{
    AssertLockHeld(cs_main);
    AssertLockHeld(m_pool.cs);
    const CTransaction& tx = *ws.m_ptx;
    TxValidationState& state = ws.m_state;

    constexpr unsigned int scriptVerifyFlags = STANDARD_SCRIPT_VERIFY_FLAGS;

    // Check input scripts and signatures.
    // This is done last to help prevent CPU exhaustion denial-of-service attacks.
    if (!CheckInputScripts(tx, state, m_view, scriptVerifyFlags, true, false, ws.m_precomputed_txdata, GetValidationCache())) {
        // SCRIPT_VERIFY_CLEANSTACK requires SCRIPT_VERIFY_WITNESS, so we
        // need to turn both off, and compare against just turning off CLEANSTACK
        // to see if the failure is specifically due to witness validation.
        TxValidationState state_dummy; // Want reported failures to be from first CheckInputScripts
        if (!tx.HasWitness() && CheckInputScripts(tx, state_dummy, m_view, scriptVerifyFlags & ~(SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_CLEANSTACK), true, false, ws.m_precomputed_txdata, GetValidationCache()) &&
                !CheckInputScripts(tx, state_dummy, m_view, scriptVerifyFlags & ~SCRIPT_VERIFY_CLEANSTACK, true, false, ws.m_precomputed_txdata, GetValidationCache())) {
            // Only the witness is missing, so the transaction itself may be fine.
            state.Invalid(TxValidationResult::TX_WITNESS_STRIPPED,
                    state.GetRejectReason(), state.GetDebugMessage());
        }
        return false; // state filled in by CheckInputScripts
    }

    return true;
}